

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O2

int float32_eq_quiet_x86_64(float32 a,float32 b,float_status *status)

{
  uint32_t a_2;
  float32 fVar1;
  float32 fVar2;
  uint uVar3;
  uint32_t a_1;
  
  fVar1 = float32_squash_input_denormal_x86_64(a,status);
  fVar2 = float32_squash_input_denormal_x86_64(b,status);
  if (((~fVar1 & 0x7f800000) == 0 && (fVar1 & 0x7fffff) != 0) ||
     ((fVar2 & 0x7fffff) != 0 && (~fVar2 & 0x7f800000) == 0)) {
    if (((fVar1 & 0x7fc00000) == 0x7f800000 && (fVar1 & 0x3fffff) != 0) ||
       (uVar3 = 0, (fVar2 & 0x3fffff) != 0 && (fVar2 & 0x7fc00000) == 0x7f800000)) {
      status->float_exception_flags = status->float_exception_flags | 1;
      uVar3 = 0;
    }
  }
  else {
    uVar3 = (uint)(((fVar2 | fVar1) & 0x7fffffff) == 0 || fVar1 == fVar2);
  }
  return uVar3;
}

Assistant:

int float32_eq_quiet(float32 a, float32 b, float_status *status)
{
    a = float32_squash_input_denormal(a, status);
    b = float32_squash_input_denormal(b, status);

    if (    ( ( extractFloat32Exp( a ) == 0xFF ) && extractFloat32Frac( a ) )
         || ( ( extractFloat32Exp( b ) == 0xFF ) && extractFloat32Frac( b ) )
       ) {
        if (float32_is_signaling_nan(a, status)
         || float32_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return 0;
    }
    return ( float32_val(a) == float32_val(b) ) ||
            ( (uint32_t) ( ( float32_val(a) | float32_val(b) )<<1 ) == 0 );
}